

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scrfd_crowdhuman.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  Allocator **ppAVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  char *pcVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  void *pvVar13;
  int *piVar14;
  bool bVar15;
  undefined1 auVar16 [16];
  undefined1 *puVar17;
  char cVar18;
  int iVar19;
  int iVar20;
  float *pfVar21;
  size_t sVar22;
  uint uVar23;
  ulong uVar24;
  long lVar25;
  pointer pFVar26;
  uint uVar27;
  int iVar28;
  int top;
  __m128 t_2;
  int iVar31;
  ulong uVar30;
  int iVar29;
  __m128 t;
  float fVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  float fVar35;
  float fVar39;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  vector<FaceObject,_std::allocator<FaceObject>_> faceobjects32;
  undefined1 local_468 [64];
  size_t local_428;
  Extractor ex;
  undefined1 local_408 [32];
  Allocator *local_3e8;
  int iStack_3e0;
  int iStack_3dc;
  undefined1 auStack_3d8 [12];
  size_t local_3c8;
  vector<FaceObject,_std::allocator<FaceObject>_> faceproposals;
  vector<float,_std::allocator<float>_> areas;
  undefined1 local_348 [32];
  Allocator *local_328;
  int iStack_320;
  int iStack_31c;
  undefined1 auStack_318 [12];
  size_t local_308;
  Size label_size;
  int *local_2f8;
  Allocator *local_2e0;
  vector<FaceObject,_std::allocator<FaceObject>_> faceobjects;
  undefined1 local_298 [64];
  size_t local_258;
  undefined8 local_248;
  int iStack_240;
  int iStack_23c;
  undefined1 local_238 [16];
  Mat image;
  undefined4 local_220;
  int iStack_21c;
  Allocator *local_208;
  float norm_vals [3];
  float mean_vals [3];
  Net scrfd;
  Mat m;
  undefined8 local_88;
  uchar *local_80;
  
  if (argc != 2) {
    main_cold_1();
    return -1;
  }
  pcVar10 = argv[1];
  std::__cxx11::string::string((string *)&scrfd,pcVar10,(allocator *)&image);
  cv::imread((string *)&m,(int)&scrfd);
  if ((Allocator **)scrfd._vptr_Net != &scrfd.opt.blob_allocator) {
    operator_delete(scrfd._vptr_Net);
  }
  cVar18 = cv::Mat::empty();
  if (cVar18 != '\0') {
    fprintf(_stderr,"cv::imread %s failed\n",pcVar10);
    iVar19 = -1;
    goto LAB_00161ab4;
  }
  faceobjects.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  faceobjects.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  faceobjects.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ncnn::Net::Net(&scrfd);
  scrfd.opt.use_vulkan_compute = true;
  iVar19 = ncnn::Net::load_param(&scrfd,"scrfd_crowdhuman.param");
  if ((iVar19 != 0) || (iVar19 = ncnn::Net::load_model(&scrfd,"scrfd_crowdhuman.bin"), iVar19 != 0))
  {
    exit(-1);
  }
  iVar19 = (int)local_88;
  iVar20 = (int)((ulong)local_88 >> 0x20);
  if (iVar19 < iVar20) {
    fVar32 = 640.0 / (float)iVar20;
    local_248._4_4_ = (int)((float)iVar19 * fVar32);
    local_248._0_4_ = 0x280;
  }
  else {
    fVar32 = 640.0 / (float)iVar19;
    local_248._0_4_ = (int)((float)iVar20 * fVar32);
    local_248._4_4_ = 0x280;
  }
  local_238 = ZEXT416((uint)fVar32);
  iStack_240 = 0;
  iStack_23c = 0;
  ncnn::Mat::from_pixels_resize
            ((Mat *)&image,local_80,0x10002,iVar20,iVar19,(int)local_248,local_248._4_4_,
             (Allocator *)0x0);
  local_258 = 0;
  local_298._0_4_ = 0;
  local_298._4_4_ = 0;
  local_298._8_4_ = 0;
  local_298._12_4_ = 0;
  local_298._16_4_ = 0;
  local_298._20_4_ = 0;
  local_298._24_4_ = 0;
  local_298._32_8_ = (Allocator *)0x0;
  local_298._40_4_ = 0;
  local_298._44_4_ = 0;
  local_298._48_12_ = SUB1612((undefined1  [16])0x0,4);
  ncnn::Option::Option((Option *)&areas);
  iVar29 = (((int)local_248 + 0x1f) / 0x20) * 0x20 - (int)local_248;
  iVar31 = ((local_248._4_4_ + 0x1f) / 0x20) * 0x20 - local_248._4_4_;
  iVar28 = iVar29 / 2;
  top = iVar31 / 2;
  iStack_240 = -iStack_240 / 2;
  iStack_23c = -iStack_23c / 2;
  local_248 = CONCAT44(top,iVar28);
  ncnn::copy_make_border
            ((Mat *)&image,(Mat *)local_298,top,iVar31 - top,iVar28,iVar29 - iVar28,0,0.0,
             (Option *)&areas);
  mean_vals[0] = 127.5;
  mean_vals[1] = 127.5;
  mean_vals[2] = 127.5;
  norm_vals[0] = 0.0078125;
  norm_vals[1] = 0.0078125;
  norm_vals[2] = 0.0078125;
  ncnn::Mat::substract_mean_normalize((Mat *)local_298,mean_vals,norm_vals);
  ncnn::Net::create_extractor((Net *)&ex);
  ncnn::Extractor::input(&ex,"input.1",(Mat *)local_298);
  faceproposals.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  faceproposals.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  faceproposals.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_finish.
  _0_4_ = 0;
  areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_finish.
  _4_4_ = 0;
  areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_428 = 0;
  local_468._0_4_ = 0;
  local_468._4_4_ = 0;
  local_468._8_4_ = 0;
  local_468._12_4_ = 0;
  local_468._16_8_ = 0;
  local_468._24_4_ = 0;
  local_468._32_8_ = (Allocator *)0x0;
  local_468._40_4_ = 0;
  local_468._44_4_ = 0;
  local_468._48_12_ = SUB1612((undefined1  [16])0x0,4);
  ncnn::Extractor::extract(&ex,"490",(Mat *)&areas,0);
  ncnn::Extractor::extract(&ex,"493",(Mat *)local_468,0);
  local_3c8 = 0;
  local_408._0_4_ = 0;
  local_408._4_4_ = 0;
  local_408._8_4_ = 0;
  local_408._12_4_ = 0;
  local_408._16_12_ = SUB1612((undefined1  [16])0x0,4);
  local_3e8 = (Allocator *)0x0;
  iStack_3e0 = 0;
  iStack_3dc = 0;
  auStack_3d8 = SUB1612((undefined1  [16])0x0,4);
  ncnn::Mat::create((Mat *)local_408,1,4,(Allocator *)0x0);
  *(undefined4 *)CONCAT44(local_408._4_4_,local_408._0_4_) = 0x40000000;
  local_308 = 0;
  local_348._0_4_ = 0;
  local_348._4_4_ = 0;
  local_348._8_4_ = 0;
  local_348._12_4_ = 0;
  local_348._16_12_ = SUB1612((undefined1  [16])0x0,4);
  local_328 = (Allocator *)0x0;
  iStack_320 = 0;
  iStack_31c = 0;
  auStack_318 = SUB1612((undefined1  [16])0x0,4);
  ncnn::Mat::create((Mat *)local_348,1,4,(Allocator *)0x0);
  *(undefined4 *)CONCAT44(local_348._4_4_,local_348._0_4_) = 0x40400000;
  generate_anchors((Mat *)&label_size,8,(Mat *)local_408,(Mat *)local_348);
  faceobjects32.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  faceobjects32.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  faceobjects32.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  generate_proposals((Mat *)&label_size,8,(Mat *)&areas,(Mat *)local_468,0.0,&faceobjects32);
  std::vector<FaceObject,std::allocator<FaceObject>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<FaceObject*,std::vector<FaceObject,std::allocator<FaceObject>>>>
            ((vector<FaceObject,std::allocator<FaceObject>> *)&faceproposals,
             faceproposals.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
             super__Vector_impl_data._M_finish,
             faceobjects32.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
             super__Vector_impl_data._M_start);
  if (faceobjects32.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(faceobjects32.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_2f8 != (int *)0x0) {
    LOCK();
    *local_2f8 = *local_2f8 + -1;
    UNLOCK();
    if (*local_2f8 == 0) {
      if (local_2e0 == (Allocator *)0x0) {
        if ((void *)CONCAT44(label_size.height,label_size.width) != (void *)0x0) {
          free((void *)CONCAT44(label_size.height,label_size.width));
        }
      }
      else {
        (*local_2e0->_vptr_Allocator[3])();
      }
    }
  }
  piVar14 = (int *)CONCAT44(local_348._12_4_,local_348._8_4_);
  if (piVar14 != (int *)0x0) {
    LOCK();
    *piVar14 = *piVar14 + -1;
    UNLOCK();
    if (*piVar14 == 0) {
      if (local_328 == (Allocator *)0x0) {
        if ((void *)CONCAT44(local_348._4_4_,local_348._0_4_) != (void *)0x0) {
          free((void *)CONCAT44(local_348._4_4_,local_348._0_4_));
        }
      }
      else {
        (*local_328->_vptr_Allocator[3])();
      }
    }
  }
  piVar14 = (int *)CONCAT44(local_408._12_4_,local_408._8_4_);
  if (piVar14 != (int *)0x0) {
    LOCK();
    *piVar14 = *piVar14 + -1;
    UNLOCK();
    if (*piVar14 == 0) {
      if (local_3e8 == (Allocator *)0x0) {
        if ((void *)CONCAT44(local_408._4_4_,local_408._0_4_) != (void *)0x0) {
          free((void *)CONCAT44(local_408._4_4_,local_408._0_4_));
        }
      }
      else {
        (*local_3e8->_vptr_Allocator[3])();
      }
    }
  }
  piVar14 = (int *)CONCAT44(local_468._12_4_,local_468._8_4_);
  if (piVar14 != (int *)0x0) {
    LOCK();
    *piVar14 = *piVar14 + -1;
    UNLOCK();
    if (*piVar14 == 0) {
      if ((Allocator *)local_468._32_8_ == (Allocator *)0x0) {
        if ((void *)CONCAT44(local_468._4_4_,local_468._0_4_) != (void *)0x0) {
          free((void *)CONCAT44(local_468._4_4_,local_468._0_4_));
        }
      }
      else {
        (*(*(_func_int ***)local_468._32_8_)[3])();
      }
    }
  }
  piVar14 = (int *)CONCAT44(areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_finish._4_4_,
                            areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_finish._0_4_);
  if (piVar14 != (int *)0x0) {
    LOCK();
    *piVar14 = *piVar14 + -1;
    UNLOCK();
    if ((*piVar14 == 0) &&
       (areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0)) {
      free(areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
           _M_start);
    }
  }
  areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_finish.
  _0_4_ = 0;
  areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_finish.
  _4_4_ = 0;
  areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_428 = 0;
  local_468._0_4_ = 0;
  local_468._4_4_ = 0;
  local_468._8_4_ = 0;
  local_468._12_4_ = 0;
  local_468._16_8_ = 0;
  local_468._24_4_ = 0;
  local_468._32_8_ = (Allocator *)0x0;
  local_468._40_4_ = 0;
  local_468._44_4_ = 0;
  local_468._48_12_ = SUB1612((undefined1  [16])0x0,4);
  ncnn::Extractor::extract(&ex,"510",(Mat *)&areas,0);
  ncnn::Extractor::extract(&ex,"513",(Mat *)local_468,0);
  local_3c8 = 0;
  local_408._0_4_ = 0;
  local_408._4_4_ = 0;
  local_408._8_4_ = 0;
  local_408._12_4_ = 0;
  local_408._16_12_ = SUB1612((undefined1  [16])0x0,4);
  local_3e8 = (Allocator *)0x0;
  iStack_3e0 = 0;
  iStack_3dc = 0;
  auStack_3d8 = SUB1612((undefined1  [16])0x0,4);
  ncnn::Mat::create((Mat *)local_408,1,4,(Allocator *)0x0);
  *(undefined4 *)CONCAT44(local_408._4_4_,local_408._0_4_) = 0x40000000;
  local_308 = 0;
  local_348._0_4_ = 0;
  local_348._4_4_ = 0;
  local_348._8_4_ = 0;
  local_348._12_4_ = 0;
  local_348._16_12_ = SUB1612((undefined1  [16])0x0,4);
  local_328 = (Allocator *)0x0;
  iStack_320 = 0;
  iStack_31c = 0;
  auStack_318 = SUB1612((undefined1  [16])0x0,4);
  ncnn::Mat::create((Mat *)local_348,1,4,(Allocator *)0x0);
  *(undefined4 *)CONCAT44(local_348._4_4_,local_348._0_4_) = 0x40400000;
  generate_anchors((Mat *)&label_size,0x10,(Mat *)local_408,(Mat *)local_348);
  faceobjects32.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  faceobjects32.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  faceobjects32.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  generate_proposals((Mat *)&label_size,0x10,(Mat *)&areas,(Mat *)local_468,0.0,&faceobjects32);
  std::vector<FaceObject,std::allocator<FaceObject>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<FaceObject*,std::vector<FaceObject,std::allocator<FaceObject>>>>
            ((vector<FaceObject,std::allocator<FaceObject>> *)&faceproposals,
             faceproposals.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
             super__Vector_impl_data._M_finish,
             faceobjects32.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
             super__Vector_impl_data._M_start);
  if (faceobjects32.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(faceobjects32.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_2f8 != (int *)0x0) {
    LOCK();
    *local_2f8 = *local_2f8 + -1;
    UNLOCK();
    if (*local_2f8 == 0) {
      if (local_2e0 == (Allocator *)0x0) {
        if ((void *)CONCAT44(label_size.height,label_size.width) != (void *)0x0) {
          free((void *)CONCAT44(label_size.height,label_size.width));
        }
      }
      else {
        (*local_2e0->_vptr_Allocator[3])();
      }
    }
  }
  piVar14 = (int *)CONCAT44(local_348._12_4_,local_348._8_4_);
  if (piVar14 != (int *)0x0) {
    LOCK();
    *piVar14 = *piVar14 + -1;
    UNLOCK();
    if (*piVar14 == 0) {
      if (local_328 == (Allocator *)0x0) {
        if ((void *)CONCAT44(local_348._4_4_,local_348._0_4_) != (void *)0x0) {
          free((void *)CONCAT44(local_348._4_4_,local_348._0_4_));
        }
      }
      else {
        (*local_328->_vptr_Allocator[3])();
      }
    }
  }
  piVar14 = (int *)CONCAT44(local_408._12_4_,local_408._8_4_);
  if (piVar14 != (int *)0x0) {
    LOCK();
    *piVar14 = *piVar14 + -1;
    UNLOCK();
    if (*piVar14 == 0) {
      if (local_3e8 == (Allocator *)0x0) {
        if ((void *)CONCAT44(local_408._4_4_,local_408._0_4_) != (void *)0x0) {
          free((void *)CONCAT44(local_408._4_4_,local_408._0_4_));
        }
      }
      else {
        (*local_3e8->_vptr_Allocator[3])();
      }
    }
  }
  piVar14 = (int *)CONCAT44(local_468._12_4_,local_468._8_4_);
  if (piVar14 != (int *)0x0) {
    LOCK();
    *piVar14 = *piVar14 + -1;
    UNLOCK();
    if (*piVar14 == 0) {
      if ((Allocator *)local_468._32_8_ == (Allocator *)0x0) {
        if ((void *)CONCAT44(local_468._4_4_,local_468._0_4_) != (void *)0x0) {
          free((void *)CONCAT44(local_468._4_4_,local_468._0_4_));
        }
      }
      else {
        (*(*(_func_int ***)local_468._32_8_)[3])();
      }
    }
  }
  piVar14 = (int *)CONCAT44(areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_finish._4_4_,
                            areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_finish._0_4_);
  if (piVar14 != (int *)0x0) {
    LOCK();
    *piVar14 = *piVar14 + -1;
    UNLOCK();
    if ((*piVar14 == 0) &&
       (areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0)) {
      free(areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
           _M_start);
    }
  }
  areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_finish.
  _0_4_ = 0;
  areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_finish.
  _4_4_ = 0;
  areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_428 = 0;
  local_468._0_4_ = 0;
  local_468._4_4_ = 0;
  local_468._8_4_ = 0;
  local_468._12_4_ = 0;
  local_468._16_8_ = 0;
  local_468._24_4_ = 0;
  local_468._32_8_ = (Allocator *)0x0;
  local_468._40_4_ = 0;
  local_468._44_4_ = 0;
  local_468._48_12_ = SUB1612((undefined1  [16])0x0,4);
  ncnn::Extractor::extract(&ex,"530",(Mat *)&areas,0);
  ncnn::Extractor::extract(&ex,"533",(Mat *)local_468,0);
  local_3c8 = 0;
  local_408._0_4_ = 0;
  local_408._4_4_ = 0;
  local_408._8_4_ = 0;
  local_408._12_4_ = 0;
  local_408._16_12_ = SUB1612((undefined1  [16])0x0,4);
  local_3e8 = (Allocator *)0x0;
  iStack_3e0 = 0;
  iStack_3dc = 0;
  auStack_3d8 = SUB1612((undefined1  [16])0x0,4);
  ncnn::Mat::create((Mat *)local_408,1,4,(Allocator *)0x0);
  *(undefined4 *)CONCAT44(local_408._4_4_,local_408._0_4_) = 0x40000000;
  local_308 = 0;
  local_348._0_4_ = 0;
  local_348._4_4_ = 0;
  local_348._8_4_ = 0;
  local_348._12_4_ = 0;
  local_348._16_12_ = SUB1612((undefined1  [16])0x0,4);
  local_328 = (Allocator *)0x0;
  iStack_320 = 0;
  iStack_31c = 0;
  auStack_318 = SUB1612((undefined1  [16])0x0,4);
  ncnn::Mat::create((Mat *)local_348,1,4,(Allocator *)0x0);
  *(undefined4 *)CONCAT44(local_348._4_4_,local_348._0_4_) = 0x40400000;
  generate_anchors((Mat *)&label_size,0x20,(Mat *)local_408,(Mat *)local_348);
  faceobjects32.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  faceobjects32.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  faceobjects32.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  generate_proposals((Mat *)&label_size,0x20,(Mat *)&areas,(Mat *)local_468,0.0,&faceobjects32);
  std::vector<FaceObject,std::allocator<FaceObject>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<FaceObject*,std::vector<FaceObject,std::allocator<FaceObject>>>>
            ((vector<FaceObject,std::allocator<FaceObject>> *)&faceproposals,
             faceproposals.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
             super__Vector_impl_data._M_finish,
             faceobjects32.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
             super__Vector_impl_data._M_start);
  if (faceobjects32.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(faceobjects32.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_2f8 != (int *)0x0) {
    LOCK();
    *local_2f8 = *local_2f8 + -1;
    UNLOCK();
    if (*local_2f8 == 0) {
      if (local_2e0 == (Allocator *)0x0) {
        if ((void *)CONCAT44(label_size.height,label_size.width) != (void *)0x0) {
          free((void *)CONCAT44(label_size.height,label_size.width));
        }
      }
      else {
        (*local_2e0->_vptr_Allocator[3])();
      }
    }
  }
  piVar14 = (int *)CONCAT44(local_348._12_4_,local_348._8_4_);
  if (piVar14 != (int *)0x0) {
    LOCK();
    *piVar14 = *piVar14 + -1;
    UNLOCK();
    if (*piVar14 == 0) {
      if (local_328 == (Allocator *)0x0) {
        if ((void *)CONCAT44(local_348._4_4_,local_348._0_4_) != (void *)0x0) {
          free((void *)CONCAT44(local_348._4_4_,local_348._0_4_));
        }
      }
      else {
        (*local_328->_vptr_Allocator[3])();
      }
    }
  }
  piVar14 = (int *)CONCAT44(local_408._12_4_,local_408._8_4_);
  if (piVar14 != (int *)0x0) {
    LOCK();
    *piVar14 = *piVar14 + -1;
    UNLOCK();
    if (*piVar14 == 0) {
      if (local_3e8 == (Allocator *)0x0) {
        if ((void *)CONCAT44(local_408._4_4_,local_408._0_4_) != (void *)0x0) {
          free((void *)CONCAT44(local_408._4_4_,local_408._0_4_));
        }
      }
      else {
        (*local_3e8->_vptr_Allocator[3])();
      }
    }
  }
  piVar14 = (int *)CONCAT44(local_468._12_4_,local_468._8_4_);
  if (piVar14 != (int *)0x0) {
    LOCK();
    *piVar14 = *piVar14 + -1;
    UNLOCK();
    if (*piVar14 == 0) {
      if ((Allocator *)local_468._32_8_ == (Allocator *)0x0) {
        if ((void *)CONCAT44(local_468._4_4_,local_468._0_4_) != (void *)0x0) {
          free((void *)CONCAT44(local_468._4_4_,local_468._0_4_));
        }
      }
      else {
        (*(*(_func_int ***)local_468._32_8_)[3])();
      }
    }
  }
  piVar14 = (int *)CONCAT44(areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_finish._4_4_,
                            areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_finish._0_4_);
  if (piVar14 != (int *)0x0) {
    LOCK();
    *piVar14 = *piVar14 + -1;
    UNLOCK();
    if ((*piVar14 == 0) &&
       (areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0)) {
      free(areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
           _M_start);
    }
  }
  areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_finish.
  _0_4_ = 0;
  areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_finish.
  _4_4_ = 0;
  areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_428 = 0;
  local_468._0_4_ = 0;
  local_468._4_4_ = 0;
  local_468._8_4_ = 0;
  local_468._12_4_ = 0;
  local_468._16_8_ = 0;
  local_468._24_4_ = 0;
  local_468._32_8_ = (Allocator *)0x0;
  local_468._40_4_ = 0;
  local_468._44_4_ = 0;
  local_468._48_12_ = SUB1612((undefined1  [16])0x0,4);
  ncnn::Extractor::extract(&ex,"550",(Mat *)&areas,0);
  ncnn::Extractor::extract(&ex,"553",(Mat *)local_468,0);
  local_3c8 = 0;
  local_408._0_4_ = 0;
  local_408._4_4_ = 0;
  local_408._8_4_ = 0;
  local_408._12_4_ = 0;
  local_408._16_12_ = SUB1612((undefined1  [16])0x0,4);
  local_3e8 = (Allocator *)0x0;
  iStack_3e0 = 0;
  iStack_3dc = 0;
  auStack_3d8 = SUB1612((undefined1  [16])0x0,4);
  ncnn::Mat::create((Mat *)local_408,1,4,(Allocator *)0x0);
  *(undefined4 *)CONCAT44(local_408._4_4_,local_408._0_4_) = 0x40000000;
  local_308 = 0;
  local_348._0_4_ = 0;
  local_348._4_4_ = 0;
  local_348._8_4_ = 0;
  local_348._12_4_ = 0;
  local_348._16_12_ = SUB1612((undefined1  [16])0x0,4);
  local_328 = (Allocator *)0x0;
  iStack_320 = 0;
  iStack_31c = 0;
  auStack_318 = SUB1612((undefined1  [16])0x0,4);
  ncnn::Mat::create((Mat *)local_348,1,4,(Allocator *)0x0);
  *(undefined4 *)CONCAT44(local_348._4_4_,local_348._0_4_) = 0x40400000;
  generate_anchors((Mat *)&label_size,0x40,(Mat *)local_408,(Mat *)local_348);
  faceobjects32.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  faceobjects32.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  faceobjects32.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  generate_proposals((Mat *)&label_size,0x40,(Mat *)&areas,(Mat *)local_468,0.0,&faceobjects32);
  std::vector<FaceObject,std::allocator<FaceObject>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<FaceObject*,std::vector<FaceObject,std::allocator<FaceObject>>>>
            ((vector<FaceObject,std::allocator<FaceObject>> *)&faceproposals,
             faceproposals.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
             super__Vector_impl_data._M_finish,
             faceobjects32.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
             super__Vector_impl_data._M_start);
  if (faceobjects32.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(faceobjects32.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_2f8 != (int *)0x0) {
    LOCK();
    *local_2f8 = *local_2f8 + -1;
    UNLOCK();
    if (*local_2f8 == 0) {
      if (local_2e0 == (Allocator *)0x0) {
        if ((void *)CONCAT44(label_size.height,label_size.width) != (void *)0x0) {
          free((void *)CONCAT44(label_size.height,label_size.width));
        }
      }
      else {
        (*local_2e0->_vptr_Allocator[3])();
      }
    }
  }
  piVar14 = (int *)CONCAT44(local_348._12_4_,local_348._8_4_);
  if (piVar14 != (int *)0x0) {
    LOCK();
    *piVar14 = *piVar14 + -1;
    UNLOCK();
    if (*piVar14 == 0) {
      if (local_328 == (Allocator *)0x0) {
        if ((void *)CONCAT44(local_348._4_4_,local_348._0_4_) != (void *)0x0) {
          free((void *)CONCAT44(local_348._4_4_,local_348._0_4_));
        }
      }
      else {
        (*local_328->_vptr_Allocator[3])();
      }
    }
  }
  piVar14 = (int *)CONCAT44(local_408._12_4_,local_408._8_4_);
  if (piVar14 != (int *)0x0) {
    LOCK();
    *piVar14 = *piVar14 + -1;
    UNLOCK();
    if (*piVar14 == 0) {
      if (local_3e8 == (Allocator *)0x0) {
        if ((void *)CONCAT44(local_408._4_4_,local_408._0_4_) != (void *)0x0) {
          free((void *)CONCAT44(local_408._4_4_,local_408._0_4_));
        }
      }
      else {
        (*local_3e8->_vptr_Allocator[3])();
      }
    }
  }
  piVar14 = (int *)CONCAT44(local_468._12_4_,local_468._8_4_);
  if (piVar14 != (int *)0x0) {
    LOCK();
    *piVar14 = *piVar14 + -1;
    UNLOCK();
    if (*piVar14 == 0) {
      if ((Allocator *)local_468._32_8_ == (Allocator *)0x0) {
        if ((void *)CONCAT44(local_468._4_4_,local_468._0_4_) != (void *)0x0) {
          free((void *)CONCAT44(local_468._4_4_,local_468._0_4_));
        }
      }
      else {
        (*(*(_func_int ***)local_468._32_8_)[3])();
      }
    }
  }
  piVar14 = (int *)CONCAT44(areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_finish._4_4_,
                            areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_finish._0_4_);
  if (piVar14 != (int *)0x0) {
    LOCK();
    *piVar14 = *piVar14 + -1;
    UNLOCK();
    if ((*piVar14 == 0) &&
       (areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0)) {
      free(areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
           _M_start);
    }
  }
  areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_finish.
  _0_4_ = 0;
  areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_finish.
  _4_4_ = 0;
  areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_428 = 0;
  local_468._0_4_ = 0;
  local_468._4_4_ = 0;
  local_468._8_4_ = 0;
  local_468._12_4_ = 0;
  local_468._16_8_ = 0;
  local_468._24_4_ = 0;
  local_468._32_8_ = (Allocator *)0x0;
  local_468._40_4_ = 0;
  local_468._44_4_ = 0;
  local_468._48_12_ = SUB1612((undefined1  [16])0x0,4);
  ncnn::Extractor::extract(&ex,"570",(Mat *)&areas,0);
  ncnn::Extractor::extract(&ex,"573",(Mat *)local_468,0);
  local_3c8 = 0;
  local_408._0_4_ = 0;
  local_408._4_4_ = 0;
  local_408._8_4_ = 0;
  local_408._12_4_ = 0;
  local_408._16_12_ = SUB1612((undefined1  [16])0x0,4);
  local_3e8 = (Allocator *)0x0;
  iStack_3e0 = 0;
  iStack_3dc = 0;
  auStack_3d8 = SUB1612((undefined1  [16])0x0,4);
  ncnn::Mat::create((Mat *)local_408,1,4,(Allocator *)0x0);
  *(undefined4 *)CONCAT44(local_408._4_4_,local_408._0_4_) = 0x40000000;
  local_308 = 0;
  local_348._0_4_ = 0;
  local_348._4_4_ = 0;
  local_348._8_4_ = 0;
  local_348._12_4_ = 0;
  local_348._16_12_ = SUB1612((undefined1  [16])0x0,4);
  local_328 = (Allocator *)0x0;
  iStack_320 = 0;
  iStack_31c = 0;
  auStack_318 = SUB1612((undefined1  [16])0x0,4);
  ncnn::Mat::create((Mat *)local_348,1,4,(Allocator *)0x0);
  *(undefined4 *)CONCAT44(local_348._4_4_,local_348._0_4_) = 0x40400000;
  generate_anchors((Mat *)&label_size,0x80,(Mat *)local_408,(Mat *)local_348);
  faceobjects32.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  faceobjects32.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  faceobjects32.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  generate_proposals((Mat *)&label_size,0x80,(Mat *)&areas,(Mat *)local_468,0.0,&faceobjects32);
  std::vector<FaceObject,std::allocator<FaceObject>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<FaceObject*,std::vector<FaceObject,std::allocator<FaceObject>>>>
            ((vector<FaceObject,std::allocator<FaceObject>> *)&faceproposals,
             faceproposals.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
             super__Vector_impl_data._M_finish,
             faceobjects32.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
             super__Vector_impl_data._M_start,
             faceobjects32.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
             super__Vector_impl_data._M_finish);
  if (faceobjects32.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(faceobjects32.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_2f8 != (int *)0x0) {
    LOCK();
    *local_2f8 = *local_2f8 + -1;
    UNLOCK();
    if (*local_2f8 == 0) {
      if (local_2e0 == (Allocator *)0x0) {
        if ((void *)CONCAT44(label_size.height,label_size.width) != (void *)0x0) {
          free((void *)CONCAT44(label_size.height,label_size.width));
        }
      }
      else {
        (*local_2e0->_vptr_Allocator[3])();
      }
    }
  }
  piVar14 = (int *)CONCAT44(local_348._12_4_,local_348._8_4_);
  if (piVar14 != (int *)0x0) {
    LOCK();
    *piVar14 = *piVar14 + -1;
    UNLOCK();
    if (*piVar14 == 0) {
      if (local_328 == (Allocator *)0x0) {
        if ((void *)CONCAT44(local_348._4_4_,local_348._0_4_) != (void *)0x0) {
          free((void *)CONCAT44(local_348._4_4_,local_348._0_4_));
        }
      }
      else {
        (*local_328->_vptr_Allocator[3])();
      }
    }
  }
  piVar14 = (int *)CONCAT44(local_408._12_4_,local_408._8_4_);
  if (piVar14 != (int *)0x0) {
    LOCK();
    *piVar14 = *piVar14 + -1;
    UNLOCK();
    if (*piVar14 == 0) {
      if (local_3e8 == (Allocator *)0x0) {
        if ((void *)CONCAT44(local_408._4_4_,local_408._0_4_) != (void *)0x0) {
          free((void *)CONCAT44(local_408._4_4_,local_408._0_4_));
        }
      }
      else {
        (*local_3e8->_vptr_Allocator[3])();
      }
    }
  }
  piVar14 = (int *)CONCAT44(local_468._12_4_,local_468._8_4_);
  if (piVar14 != (int *)0x0) {
    LOCK();
    *piVar14 = *piVar14 + -1;
    UNLOCK();
    if (*piVar14 == 0) {
      if ((Allocator *)local_468._32_8_ == (Allocator *)0x0) {
        if ((void *)CONCAT44(local_468._4_4_,local_468._0_4_) != (void *)0x0) {
          free((void *)CONCAT44(local_468._4_4_,local_468._0_4_));
        }
      }
      else {
        (*(*(_func_int ***)local_468._32_8_)[3])();
      }
    }
  }
  piVar14 = (int *)CONCAT44(areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_finish._4_4_,
                            areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_finish._0_4_);
  if (piVar14 != (int *)0x0) {
    LOCK();
    *piVar14 = *piVar14 + -1;
    UNLOCK();
    if ((*piVar14 == 0) &&
       (areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0)) {
      free(areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
           _M_start);
    }
  }
  pFVar26 = faceproposals.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (faceproposals.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
      super__Vector_impl_data._M_start !=
      faceproposals.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    qsort_descent_inplace
              (&faceproposals,0,
               (int)((ulong)((long)faceproposals.
                                   super__Vector_base<FaceObject,_std::allocator<FaceObject>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                            (long)faceproposals.
                                  super__Vector_base<FaceObject,_std::allocator<FaceObject>_>.
                                  _M_impl.super__Vector_impl_data._M_start) >> 2) * -0x33333333 + -1
              );
    pFVar26 = faceproposals.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
              super__Vector_impl_data._M_finish;
  }
  local_468._0_4_ = 0;
  local_468._4_4_ = 0;
  local_468._8_4_ = 0;
  local_468._12_4_ = 0;
  local_468._16_8_ = (int *)0x0;
  uVar27 = (int)((long)pFVar26 -
                 (long)faceproposals.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>.
                       _M_impl.super__Vector_impl_data._M_start >> 2) * -0x33333333;
  std::vector<float,_std::allocator<float>_>::vector
            (&areas,(long)(int)uVar27,(allocator_type *)local_408);
  if (0 < (int)uVar27) {
    pfVar21 = &((faceproposals.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
                 super__Vector_impl_data._M_start)->rect).height;
    uVar24 = 0;
    do {
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar24] = pfVar21[-1] * *pfVar21;
      uVar24 = uVar24 + 1;
      pfVar21 = pfVar21 + 5;
    } while ((uVar27 & 0x7fffffff) != uVar24);
    local_408._0_4_ = 0;
    do {
      uVar23 = (uint)((ulong)(local_468._8_8_ - CONCAT44(local_468._4_4_,local_468._0_4_)) >> 2);
      if ((int)uVar23 < 1) {
LAB_001614b8:
        if (local_468._8_8_ == local_468._16_8_) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)local_468,(iterator)local_468._8_8_,
                     (int *)local_408);
        }
        else {
          *(undefined4 *)local_468._8_8_ = local_408._0_4_;
          local_468._8_8_ = local_468._8_8_ + 4;
        }
      }
      else {
        lVar25 = (long)(int)local_408._0_4_;
        uVar24._0_4_ = faceproposals.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>.
                       _M_impl.super__Vector_impl_data._M_start[lVar25].rect.x;
        uVar24._4_4_ = faceproposals.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>.
                       _M_impl.super__Vector_impl_data._M_start[lVar25].rect.y;
        auVar34._8_8_ = 0;
        auVar34._0_8_ = uVar24;
        uVar2 = faceproposals.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
                super__Vector_impl_data._M_start[lVar25].rect.width;
        uVar6 = faceproposals.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
                super__Vector_impl_data._M_start[lVar25].rect.height;
        auVar38._0_4_ = (float)uVar2 + (float)(undefined4)uVar24;
        auVar38._4_4_ = (float)uVar6 + (float)uVar24._4_4_;
        auVar38._8_8_ = 0;
        bVar15 = true;
        uVar24 = 0;
        do {
          iVar28 = *(int *)(CONCAT44(local_468._4_4_,local_468._0_4_) + uVar24 * 4);
          uVar30._0_4_ = faceproposals.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>.
                         _M_impl.super__Vector_impl_data._M_start[iVar28].rect.x;
          uVar30._4_4_ = faceproposals.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>.
                         _M_impl.super__Vector_impl_data._M_start[iVar28].rect.y;
          auVar40._8_8_ = 0;
          auVar40._0_8_ = uVar30;
          uVar3 = faceproposals.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
                  super__Vector_impl_data._M_start[iVar28].rect.width;
          uVar7 = faceproposals.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
                  super__Vector_impl_data._M_start[iVar28].rect.height;
          auVar36._0_4_ = (float)uVar3 + (float)(undefined4)uVar30;
          auVar36._4_4_ = (float)uVar7 + (float)uVar30._4_4_;
          auVar36._8_8_ = 0;
          auVar40 = maxps(auVar40,auVar34);
          auVar36 = minps(auVar36,auVar38);
          fVar32 = auVar36._0_4_ - auVar40._0_4_;
          fVar39 = auVar36._4_4_ - auVar40._4_4_;
          fVar35 = 0.0;
          if (0.0 < fVar39 && 0.0 < fVar32) {
            fVar35 = fVar32 * fVar39;
          }
          if (0.45 < fVar35 / ((areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start[iVar28] +
                               areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                               super__Vector_impl_data._M_start[lVar25]) - fVar35)) {
            bVar15 = false;
          }
          uVar24 = uVar24 + 1;
        } while ((uVar23 & 0x7fffffff) != uVar24);
        if (bVar15) goto LAB_001614b8;
      }
      local_408._0_4_ = local_408._0_4_ + 1;
    } while ((int)local_408._0_4_ < (int)uVar27);
  }
  if (areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  uVar27 = (uint)((ulong)(local_468._8_8_ - CONCAT44(local_468._4_4_,local_468._0_4_)) >> 2);
  std::vector<FaceObject,_std::allocator<FaceObject>_>::resize(&faceobjects,(long)(int)uVar27);
  pvVar13 = (void *)CONCAT44(local_468._4_4_,local_468._0_4_);
  if ((int)uVar27 < 1) {
    if (pvVar13 != (void *)0x0) goto LAB_001615d8;
  }
  else {
    uVar30 = CONCAT44((float)iVar19 + -1.0,(float)iVar20 + -1.0);
    pfVar21 = &(faceobjects.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
                super__Vector_impl_data._M_start)->prob;
    uVar24 = 0;
    do {
      iVar19 = *(int *)((long)pvVar13 + uVar24 * 4);
      *pfVar21 = faceproposals.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
                 super__Vector_impl_data._M_start[iVar19].prob;
      uVar4 = faceproposals.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
              super__Vector_impl_data._M_start[iVar19].rect.x;
      uVar8 = faceproposals.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
              super__Vector_impl_data._M_start[iVar19].rect.y;
      uVar5 = faceproposals.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
              super__Vector_impl_data._M_start[iVar19].rect.width;
      uVar9 = faceproposals.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
              super__Vector_impl_data._M_start[iVar19].rect.height;
      auVar33._0_4_ = (float)uVar4 - (float)(int)local_248;
      auVar33._4_4_ = (float)uVar8 - (float)local_248._4_4_;
      auVar33._8_4_ = 0.0 - (float)iStack_240;
      auVar33._12_4_ = 0.0 - (float)iStack_23c;
      auVar11._4_4_ = local_238._0_4_;
      auVar11._0_4_ = local_238._0_4_;
      auVar11._8_4_ = local_238._0_4_;
      auVar11._12_4_ = local_238._0_4_;
      auVar34 = divps(auVar33,auVar11);
      auVar37._0_4_ = ((float)uVar5 + (float)uVar4) - (float)(int)local_248;
      auVar37._4_4_ = ((float)uVar9 + (float)uVar8) - (float)local_248._4_4_;
      auVar37._8_4_ = 0.0 - (float)iStack_240;
      auVar37._12_4_ = 0.0 - (float)iStack_23c;
      auVar12._4_4_ = local_238._0_4_;
      auVar12._0_4_ = local_238._0_4_;
      auVar12._8_4_ = local_238._0_4_;
      auVar12._12_4_ = local_238._0_4_;
      auVar38 = divps(auVar37,auVar12);
      auVar41._8_8_ = 0;
      auVar41._0_8_ = uVar30;
      auVar34 = minps(auVar41,auVar34);
      auVar34 = maxps(ZEXT816(0),auVar34);
      auVar42._8_8_ = 0;
      auVar42._0_8_ = uVar30;
      auVar38 = minps(auVar42,auVar38);
      auVar38 = maxps(ZEXT816(0),auVar38);
      (((FaceObject *)(pfVar21 + -4))->rect).x = (float)(int)auVar34._0_8_;
      (((FaceObject *)(pfVar21 + -4))->rect).y = (float)(int)((ulong)auVar34._0_8_ >> 0x20);
      *(ulong *)(pfVar21 + -2) =
           CONCAT44(auVar38._4_4_ - auVar34._4_4_,auVar38._0_4_ - auVar34._0_4_);
      uVar24 = uVar24 + 1;
      pfVar21 = pfVar21 + 5;
    } while ((uVar27 & 0x7fffffff) != uVar24);
LAB_001615d8:
    operator_delete(pvVar13);
  }
  if (faceproposals.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(faceproposals.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  ncnn::Extractor::~Extractor(&ex);
  piVar14 = (int *)CONCAT44(local_298._12_4_,local_298._8_4_);
  if (piVar14 != (int *)0x0) {
    LOCK();
    *piVar14 = *piVar14 + -1;
    UNLOCK();
    if (*piVar14 == 0) {
      if ((Allocator *)local_298._32_8_ == (Allocator *)0x0) {
        if ((void *)CONCAT44(local_298._4_4_,local_298._0_4_) != (void *)0x0) {
          free((void *)CONCAT44(local_298._4_4_,local_298._0_4_));
        }
      }
      else {
        (*(*(_func_int ***)local_298._32_8_)[3])();
      }
    }
  }
  piVar14 = (int *)CONCAT44(iStack_21c,local_220);
  if (piVar14 != (int *)0x0) {
    LOCK();
    *piVar14 = *piVar14 + -1;
    UNLOCK();
    if (*piVar14 == 0) {
      if (local_208 == (Allocator *)0x0) {
        if (_image != (void *)0x0) {
          free(_image);
        }
      }
      else {
        (*local_208->_vptr_Allocator[3])();
      }
    }
  }
  ncnn::Net::~Net(&scrfd);
  cv::Mat::clone();
  puVar17 = (undefined1 *)CONCAT44(local_298._4_4_,local_298._0_4_);
  if (faceobjects.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      faceobjects.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
      super__Vector_impl_data._M_start) {
    local_238 = ZEXT816(0x406fe00000000000) << 0x40;
    lVar25 = 0;
    uVar24 = 0;
    pFVar26 = faceobjects.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      local_248 = uVar24;
      local_298._0_8_ = puVar17;
      fprintf(_stderr,"%.5f at %.2f %.2f %.2f x %.2f\n",
              (double)*(float *)((long)&pFVar26->prob + lVar25),
              (double)*(float *)((long)&(pFVar26->rect).x + lVar25),
              (double)*(float *)((long)&(pFVar26->rect).y + lVar25),
              (double)*(float *)((long)&(pFVar26->rect).width + lVar25),
              (double)*(float *)((long)&(pFVar26->rect).height + lVar25));
      auVar34 = local_238;
      local_298._16_4_ = 0;
      local_298._20_4_ = 0;
      local_298._0_4_ = 0x3010000;
      pfVar21 = (float *)((long)&(pFVar26->rect).x + lVar25);
      local_408._0_4_ = (undefined4)ROUND(*pfVar21);
      local_408._4_4_ = (undefined4)ROUND(pfVar21[1]);
      local_408._8_4_ = (undefined4)ROUND(pfVar21[2]);
      local_408._12_4_ = (undefined4)ROUND(pfVar21[3]);
      scrfd._vptr_Net = (_func_int **)local_238._0_8_;
      scrfd.opt.lightmode = (bool)local_238[8];
      scrfd.opt._1_3_ = local_238._9_3_;
      scrfd.opt.num_threads = local_238._12_4_;
      scrfd.opt.blob_allocator = (Allocator *)0x0;
      scrfd.opt.workspace_allocator = (Allocator *)0x0;
      local_238 = auVar34;
      local_298._8_8_ = &image;
      cv::rectangle((string *)local_298,local_408,&scrfd,1,8,0);
      sprintf((char *)&scrfd,"%.1f%%",(double)(*(float *)((long)&pFVar26->prob + lVar25) * 100.0));
      auVar16._12_4_ = 0;
      auVar16._0_12_ =
           (undefined1  [12])
           faceobjects32.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
           super__Vector_impl_data._4_12_;
      faceobjects32.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
      super__Vector_impl_data._0_16_ = auVar16 << 0x20;
      local_298._0_8_ = local_298 + 0x10;
      sVar22 = strlen((char *)&scrfd);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_298,&scrfd,(long)&scrfd._vptr_Net + sVar22);
      cv::getTextSize((string *)&label_size,(int)(string *)local_298,0.5,0,(int *)0x1);
      if ((undefined1 *)local_298._0_8_ != local_298 + 0x10) {
        operator_delete((void *)local_298._0_8_);
      }
      iVar20 = (int)*(float *)((long)&(pFVar26->rect).x + lVar25);
      iVar19 = (int)((*(float *)((long)&(pFVar26->rect).y + lVar25) - (float)label_size.height) -
                    (float)(int)faceobjects32.
                                super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
                                super__Vector_impl_data._M_start);
      if (iVar19 < 1) {
        iVar19 = 0;
      }
      iVar28 = iStack_21c - label_size.width;
      if (label_size.width + iVar20 <= iStack_21c) {
        iVar28 = iVar20;
      }
      local_468._16_8_ = 0;
      local_468._0_4_ = 0x3010000;
      local_348._12_4_ =
           (int)faceobjects32.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
                super__Vector_impl_data._M_start + label_size.height;
      local_348._8_4_ = label_size.width;
      local_298._0_4_ = 0;
      local_298._4_4_ = 0x406fe000;
      local_298._8_4_ = 0;
      local_298._12_4_ = 0x406fe000;
      local_298._16_4_ = 0;
      local_298._20_4_ = 0x406fe000;
      local_298._24_4_ = 0;
      local_298._28_4_ = 0;
      local_348._0_4_ = iVar28;
      local_348._4_4_ = iVar19;
      local_468._8_8_ = &image;
      cv::rectangle(local_468,local_348,(string *)local_298,0xffffffff,8,0);
      local_468._16_8_ = (int *)0x0;
      local_468._0_4_ = 0x3010000;
      local_298._0_8_ = local_298 + 0x10;
      local_468._8_8_ = &image;
      sVar22 = strlen((char *)&scrfd);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_298,&scrfd,(long)&scrfd._vptr_Net + sVar22);
      faceproposals.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
      super__Vector_impl_data._M_start._4_4_ = iVar19 + label_size.height;
      faceproposals.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
      super__Vector_impl_data._M_start._0_4_ = iVar28;
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish._0_4_ = 0;
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish._4_4_ = 0;
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      cv::putText(0x3fe0000000000000,local_468,(string *)local_298,&faceproposals,0,&areas,1,8,0);
      uVar24 = local_248;
      puVar17 = (undefined1 *)local_298._0_8_;
      if ((undefined1 *)local_298._0_8_ != local_298 + 0x10) {
        operator_delete((void *)local_298._0_8_);
        puVar17 = (undefined1 *)local_298._0_8_;
      }
      local_298._4_4_ = (undefined4)((ulong)puVar17 >> 0x20);
      uVar24 = uVar24 + 1;
      lVar25 = lVar25 + 0x14;
      pFVar26 = faceobjects.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
                super__Vector_impl_data._M_start;
    } while (uVar24 < (ulong)(((long)faceobjects.
                                     super__Vector_base<FaceObject,_std::allocator<FaceObject>_>.
                                     _M_impl.super__Vector_impl_data._M_finish -
                               (long)faceobjects.
                                     super__Vector_base<FaceObject,_std::allocator<FaceObject>_>.
                                     _M_impl.super__Vector_impl_data._M_start >> 2) *
                             -0x3333333333333333));
  }
  local_298._8_8_ = &image;
  ppAVar1 = &scrfd.opt.blob_allocator;
  scrfd.opt.blob_allocator = (Allocator *)CONCAT26(scrfd.opt.blob_allocator._6_2_,0x6567616d69);
  scrfd.opt.lightmode = true;
  scrfd.opt._1_3_ = 0;
  scrfd.opt.num_threads = 0;
  local_298._16_4_ = 0;
  local_298._20_4_ = 0;
  local_298._0_4_ = 0x1010000;
  scrfd._vptr_Net = (_func_int **)ppAVar1;
  cv::imshow((string *)&scrfd,(_InputArray *)local_298);
  if ((Allocator **)scrfd._vptr_Net != ppAVar1) {
    operator_delete(scrfd._vptr_Net);
  }
  cv::waitKey(0);
  cv::Mat::~Mat(&image);
  if (faceobjects.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(faceobjects.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  iVar19 = 0;
LAB_00161ab4:
  cv::Mat::~Mat(&m);
  return iVar19;
}

Assistant:

int main(int argc, char** argv)
{
    if (argc != 2)
    {
        fprintf(stderr, "Usage: %s [imagepath]\n", argv[0]);
        return -1;
    }

    const char* imagepath = argv[1];

    cv::Mat m = cv::imread(imagepath, 1);
    if (m.empty())
    {
        fprintf(stderr, "cv::imread %s failed\n", imagepath);
        return -1;
    }

    std::vector<FaceObject> faceobjects;
    detect_scrfd(m, faceobjects);

    draw_faceobjects(m, faceobjects);

    return 0;
}